

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmSetPropertyCommand::HandleInstallMode(cmSetPropertyCommand *this)

{
  cmake *this_00;
  cmInstalledFile *file;
  _Base_ptr p_Var1;
  bool bVar2;
  ostringstream e;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  p_Var1 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    bVar2 = (_Rb_tree_header *)p_Var1 == &(this->Names)._M_t._M_impl.super__Rb_tree_header;
    if (bVar2) {
      return bVar2;
    }
    file = cmake::GetOrCreateInstalledFile
                     (this_00,(this->super_cmCommand).Makefile,(string *)(p_Var1 + 1));
    if (file == (cmInstalledFile *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"given INSTALL name that could not be found or created: ",0x37
                );
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)(p_Var1 + 1),(long)p_Var1[1]._M_parent);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      HandleInstall(this,file);
    }
    if (file == (cmInstalledFile *)0x0) break;
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  }
  return bVar2;
}

Assistant:

bool cmSetPropertyCommand::HandleInstallMode()
{
  cmake* cm = this->Makefile->GetCMakeInstance();

  for(std::set<std::string>::const_iterator i = this->Names.begin();
      i != this->Names.end(); ++i)
    {
    if(cmInstalledFile* file = cm->GetOrCreateInstalledFile(
      this->Makefile, *i))
      {
      if(!this->HandleInstall(file))
        {
        return false;
        }
      }
    else
      {
      std::ostringstream e;
      e << "given INSTALL name that could not be found or created: " << *i;
      this->SetError(e.str());
      return false;
      }
    }
  return true;
}